

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_projection_code(parser *p)

{
  char *__s1;
  int *piVar1;
  int *v;
  int iVar2;
  
  __s1 = parser_getstr(p,"code");
  piVar1 = (int *)parser_priv(p);
  if (piVar1 == (int *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = *piVar1 + 1;
  }
  v = (int *)mem_zalloc(0x68);
  parser_setpriv(p,v);
  *(int **)(v + 0x18) = piVar1;
  *v = iVar2;
  if ((iVar2 < 0x19) && (iVar2 = strcmp(__s1,element_names[iVar2]), iVar2 != 0)) {
    return PARSE_ERROR_ELEMENT_NAME_MISMATCH;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_projection_code(struct parser *p) {
	const char *code = parser_getstr(p, "code");
	struct projection *h = parser_priv(p);
	int index = h ? h->index + 1 : 0;
	struct projection *projection = mem_zalloc(sizeof *projection);

	parser_setpriv(p, projection);
	projection->next = h;
	projection->index = index;
	if ((index < ELEM_MAX) && !streq(code, element_names[index])) {
		return PARSE_ERROR_ELEMENT_NAME_MISMATCH;
	}
	return PARSE_ERROR_NONE;
}